

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O0

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_30 [4];
  int r;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  uv_connect_cb connect_cb_local;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0,(sockaddr_in *)server_addr.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x5c,"0 == uv_ip4_addr(\"0.0.0.0\", 0, &client_addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_30);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x5f,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &server_addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&tcp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,99,"!r");
    abort();
  }
  iVar1 = uv_tcp_bind(&tcp,(sockaddr *)server_addr.sin_zero,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x67,"0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0)");
    abort();
  }
  iVar1 = uv_tcp_connect(&req,&tcp,(sockaddr *)local_30,connect_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x6d,"!r");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (connect_cb_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x71,"connect_cb_calls == 1");
    abort();
  }
  if (close_cb_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x72,"close_cb_calls == 1");
    abort();
  }
  return;
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT(0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_calls == 1);
  ASSERT(close_cb_calls == 1);
}